

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

void QPDF::decryptStream(shared_ptr<QPDF::EncryptionParameters> *encp,shared_ptr<InputSource> *file,
                        QPDF *qpdf_for_warning,Pipeline **pipeline,QPDFObjGen og,
                        QPDFObjectHandle *stream_dict,bool is_root_metadata,
                        unique_ptr<Pipeline,_std::default_delete<Pipeline>_> *decrypt_pipeline)

{
  element_type *peVar1;
  Pipeline *pPVar2;
  shared_ptr<InputSource> *psVar3;
  Pipeline **ppPVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  encryption_method_e eVar8;
  undefined4 extraout_var;
  qpdf_offset_t offset;
  long *plVar9;
  QPDFObjGen QVar10;
  uchar *puVar11;
  Pl_AES_PDF *this;
  Pl_RC4 *this_00;
  size_type *psVar12;
  QPDFObjGen og_00;
  byte bVar13;
  undefined1 use_aes;
  byte bVar14;
  pointer __p;
  pointer __p_1;
  string key;
  string method_source;
  QPDFObjectHandle decode;
  QPDFObjectHandle crypt_params;
  string type;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [128];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  string local_110;
  undefined1 local_f0 [16];
  undefined1 local_e0 [32];
  shared_ptr<QPDF::EncryptionParameters> local_c0;
  shared_ptr<QPDF::EncryptionParameters> local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  QPDF *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_90;
  QPDF *local_80;
  shared_ptr<InputSource> *local_78;
  QPDFObjGen local_70;
  Pipeline **local_68;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  local_a0._M_pi = &local_90;
  local_98 = (QPDF *)0x0;
  local_90._vptr__Sp_counted_base._0_1_ = 0;
  local_1b0._0_8_ = local_1b0 + 0x10;
  local_80 = qpdf_for_warning;
  local_78 = file;
  local_70 = og;
  local_68 = pipeline;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/Type","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_130,(string *)stream_dict);
  bVar5 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_130);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
  }
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if (bVar5) {
    local_130._0_8_ = (element_type *)local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"/Type","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1d0,(string *)stream_dict);
    QPDFObjectHandle::getName_abi_cxx11_((string *)local_1b0,(QPDFObjectHandle *)local_1d0);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)local_1b0);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
    }
    if ((element_type *)local_130._0_8_ != (element_type *)local_120) {
      operator_delete((void *)local_130._0_8_,local_120._0_8_ + 1);
    }
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_a0);
  use_aes = (undefined1)og.obj;
  if (iVar6 == 0) goto LAB_0020b15d;
  QVar10 = (QPDFObjGen)
           (encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  if (*(int *)((long)QVar10 + 4) < 4) {
    bVar13 = 0;
  }
  else {
    local_130._0_8_ = local_120;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"/StmF from /Encrypt dictionary","");
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/Filter","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_120 + 0x10),(string *)stream_dict);
    local_1d0._0_8_ = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"/Crypt","");
    bVar5 = QPDFObjectHandle::isOrHasName
                      ((QPDFObjectHandle *)(local_120 + 0x10),(string *)local_1d0);
    if ((element_type *)local_1d0._0_8_ != (element_type *)local_1c0) {
      operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_string_length);
    }
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    use_aes = (undefined1)og.obj;
    if (bVar5) {
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/DecodeParms","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1d0,(string *)stream_dict);
      bVar5 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_1d0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
      }
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      use_aes = (undefined1)og.obj;
      local_1b0._0_8_ = local_1b0 + 0x10;
      if (bVar5) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/DecodeParms","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_120 + 0x10),(string *)stream_dict);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"/CryptFilterDecodeParms","");
        local_1d0._0_8_ = local_1c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"");
        bVar5 = QPDFObjectHandle::isDictionaryOfType
                          ((QPDFObjectHandle *)(local_120 + 0x10),(string *)local_1b0,
                           (string *)local_1d0);
        if ((element_type *)local_1d0._0_8_ != (element_type *)local_1c0) {
          operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
        }
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        eVar8 = e_unknown;
        local_1d0._8_8_ = local_110._M_string_length;
        if (bVar5) {
          local_b0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
          local_b0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_b0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_b0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_b0.
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_b0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_b0.
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_1b0._0_8_ = local_1b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/Name","");
          QPDFObjectHandle::getKey(&local_60,(string *)(local_120 + 0x10));
          eVar8 = interpretCF(&local_b0,&local_60);
          if (local_60.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
            operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
          }
          if (local_b0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.
                       super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          use_aes = 0x20;
          std::__cxx11::string::_M_replace((ulong)local_130,0,(char *)local_130._8_8_,0x27f852);
          local_1d0._8_8_ = local_110._M_string_length;
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/DecodeParms","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_120 + 0x10),(string *)stream_dict);
        bVar5 = QPDFObjectHandle::isArray((QPDFObjectHandle *)(local_120 + 0x10));
        if (bVar5) {
          local_1d0._0_8_ = local_1c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"/Filter","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_f0,(string *)stream_dict);
          bVar5 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_f0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
          }
          if ((element_type *)local_1d0._0_8_ != (element_type *)local_1c0) {
            operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
          }
        }
        else {
          bVar5 = false;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_string_length);
        }
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        use_aes = (undefined1)og.obj;
        if (bVar5 == false) goto LAB_0020ae0d;
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/Filter","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1d0,(string *)stream_dict);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/DecodeParms","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_120 + 0x10),(string *)stream_dict);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        iVar6 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_1d0);
        iVar7 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)(local_120 + 0x10));
        use_aes = (undefined1)og.obj;
        eVar8 = e_unknown;
        if (iVar6 == iVar7) {
          iVar6 = 0;
          while( true ) {
            iVar7 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_1d0);
            use_aes = (undefined1)og.obj;
            if (iVar7 <= iVar6) break;
            QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_f0,(int)local_1d0);
            local_1b0._0_8_ = local_1b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/Crypt","");
            bVar5 = QPDFObjectHandle::isNameAndEquals
                              ((QPDFObjectHandle *)local_f0,(string *)local_1b0);
            if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
              operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
            }
            if (bVar5) {
              QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_f0,(int)local_120 + 0x10);
              bVar5 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_f0);
              if (bVar5) {
                local_1b0._0_8_ = local_1b0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/Name","");
                QPDFObjectHandle::getKey(&local_40,(string *)local_f0);
                bVar5 = QPDFObjectHandle::isName(&local_40);
                if (local_40.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_40.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
                if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
                  operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
                }
                if (bVar5) {
                  local_c0.
                  super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (encp->
                         super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr;
                  local_c0.
                  super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (encp->
                       super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                  if (local_c0.
                      super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_c0.
                       super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_c0.
                            super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_c0.
                       super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_c0.
                            super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  local_1b0._0_8_ = local_1b0 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/Name","");
                  QPDFObjectHandle::getKey(&local_50,(string *)local_f0);
                  eVar8 = interpretCF(&local_c0,&local_50);
                  if (local_50.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_50.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
                    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
                  }
                  if (local_c0.
                      super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_c0.
                               super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                  og.obj = 0x28;
                  og.gen = 0;
                  std::__cxx11::string::_M_replace
                            ((ulong)local_130,0,(char *)local_130._8_8_,0x27f873);
                }
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
              }
            }
            iVar6 = iVar6 + 1;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_string_length);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
      }
      if (eVar8 == e_unknown) goto LAB_0020ae0d;
LAB_0020ae2d:
      psVar3 = local_78;
      if ((eVar8 < (e_aesv3|e_unknown)) && ((0x1dU >> (eVar8 & 0x1f) & 1) != 0)) {
        bVar14 = 0x1c >> ((byte)eVar8 & 0x1f);
        bVar13 = 0x18 >> ((byte)eVar8 & 0x1f);
      }
      else {
        iVar6 = (*((local_78->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  _vptr_InputSource[3])();
        local_1d0._0_8_ = local_1c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"");
        offset = InputSource::getLastOffset
                           ((psVar3->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                       ,"unknown encryption filter for streams (check ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130);
        plVar9 = (long *)std::__cxx11::string::append(local_f0);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_110.field_2._M_allocated_capacity = *psVar12;
          local_110.field_2._8_8_ = plVar9[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar12;
          local_110._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_110._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        QPDFExc::QPDFExc((QPDFExc *)local_1b0,qpdf_e_damaged_pdf,
                         (string *)CONCAT44(extraout_var,iVar6),(string *)local_1d0,offset,
                         (string *)(local_120 + 0x10));
        use_aes = (undefined1)offset;
        warn(local_80,(QPDFExc *)local_1b0);
        QPDFExc::~QPDFExc((QPDFExc *)local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)local_f0._0_8_ != (element_type *)local_e0) {
          operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._0_8_ + 1));
        }
        if ((element_type *)local_1d0._0_8_ != (element_type *)local_1c0) {
          operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
        }
        ((encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ->cf_stream = e_aes;
        bVar14 = 1;
        bVar13 = 1;
      }
    }
    else {
LAB_0020ae0d:
      peVar1 = (encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if ((!is_root_metadata) || (peVar1->encrypt_metadata != false)) {
        eVar8 = peVar1->cf_stream;
        goto LAB_0020ae2d;
      }
      bVar14 = 0;
      bVar13 = 0;
    }
    if ((element_type *)local_130._0_8_ != (element_type *)local_120) {
      operator_delete((void *)local_130._0_8_,local_120._0_8_ + 1);
    }
    if ((bVar14 & 1) == 0) goto LAB_0020b15d;
    QVar10 = (QPDFObjGen)
             (encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  }
  ppPVar4 = local_68;
  local_e0._24_8_ =
       (encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._24_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._24_8_)->_M_use_count + 1;
    }
  }
  og_00.obj = bVar13 & 1;
  og_00.gen = 0;
  local_e0._16_8_ = QVar10;
  getKeyForObject_abi_cxx11_
            ((string *)local_1b0,(QPDF *)(local_e0 + 0x10),
             (shared_ptr<QPDF::EncryptionParameters> *)local_70,og_00,(bool)use_aes);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._24_8_);
  }
  if ((bVar13 & 1) == 0) {
    puVar11 = QUtil::unsigned_char_pointer((string *)local_1b0);
    if ((local_1b0._8_8_ & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(local_1b0._8_8_);
    }
    this_00 = (Pl_RC4 *)operator_new(0x58);
    Pl_RC4::Pl_RC4(this_00,"RC4 stream decryption",*ppPVar4,puVar11,(int)local_1b0._8_8_,0x10000);
    local_130._0_8_ = (element_type *)0x0;
    pPVar2 = (decrypt_pipeline->_M_t).
             super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
             super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
             super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl;
    (decrypt_pipeline->_M_t).super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl = (Pipeline *)this_00;
    if (pPVar2 != (Pipeline *)0x0) {
      (*pPVar2->_vptr_Pipeline[1])();
    }
    std::unique_ptr<Pl_RC4,_std::default_delete<Pl_RC4>_>::~unique_ptr
              ((unique_ptr<Pl_RC4,_std::default_delete<Pl_RC4>_> *)local_130);
  }
  else {
    puVar11 = QUtil::unsigned_char_pointer((string *)local_1b0);
    this = (Pl_AES_PDF *)operator_new(0xa8);
    Pl_AES_PDF::Pl_AES_PDF(this,"AES stream decryption",*ppPVar4,false,puVar11,local_1b0._8_8_);
    local_130._0_8_ = (element_type *)0x0;
    pPVar2 = (decrypt_pipeline->_M_t).
             super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
             super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
             super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl;
    (decrypt_pipeline->_M_t).super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl = (Pipeline *)this;
    if (pPVar2 != (Pipeline *)0x0) {
      (*pPVar2->_vptr_Pipeline[1])();
    }
    std::unique_ptr<Pl_AES_PDF,_std::default_delete<Pl_AES_PDF>_>::~unique_ptr
              ((unique_ptr<Pl_AES_PDF,_std::default_delete<Pl_AES_PDF>_> *)local_130);
  }
  *ppPVar4 = (decrypt_pipeline->_M_t).
             super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
             super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
             super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl;
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
LAB_0020b15d:
  if (local_a0._M_pi != &local_90) {
    operator_delete(local_a0._M_pi,
                    CONCAT71(local_90._vptr__Sp_counted_base._1_7_,
                             local_90._vptr__Sp_counted_base._0_1_) + 1);
  }
  return;
}

Assistant:

void
QPDF::decryptStream(
    std::shared_ptr<EncryptionParameters> encp,
    std::shared_ptr<InputSource> file,
    QPDF& qpdf_for_warning,
    Pipeline*& pipeline,
    QPDFObjGen og,
    QPDFObjectHandle& stream_dict,
    bool is_root_metadata,
    std::unique_ptr<Pipeline>& decrypt_pipeline)
{
    std::string type;
    if (stream_dict.getKey("/Type").isName()) {
        type = stream_dict.getKey("/Type").getName();
    }
    if (type == "/XRef") {
        QTC::TC("qpdf", "QPDF_encryption xref stream from encrypted file");
        return;
    }
    bool use_aes = false;
    if (encp->encryption_V >= 4) {
        encryption_method_e method = e_unknown;
        std::string method_source = "/StmF from /Encrypt dictionary";

        if (stream_dict.getKey("/Filter").isOrHasName("/Crypt")) {
            if (stream_dict.getKey("/DecodeParms").isDictionary()) {
                QPDFObjectHandle decode_parms = stream_dict.getKey("/DecodeParms");
                if (decode_parms.isDictionaryOfType("/CryptFilterDecodeParms")) {
                    QTC::TC("qpdf", "QPDF_encryption stream crypt filter");
                    method = interpretCF(encp, decode_parms.getKey("/Name"));
                    method_source = "stream's Crypt decode parameters";
                }
            } else if (
                stream_dict.getKey("/DecodeParms").isArray() &&
                stream_dict.getKey("/Filter").isArray()) {
                QPDFObjectHandle filter = stream_dict.getKey("/Filter");
                QPDFObjectHandle decode = stream_dict.getKey("/DecodeParms");
                if (filter.getArrayNItems() == decode.getArrayNItems()) {
                    for (int i = 0; i < filter.getArrayNItems(); ++i) {
                        if (filter.getArrayItem(i).isNameAndEquals("/Crypt")) {
                            QPDFObjectHandle crypt_params = decode.getArrayItem(i);
                            if (crypt_params.isDictionary() &&
                                crypt_params.getKey("/Name").isName()) {
                                QTC::TC("qpdf", "QPDF_encrypt crypt array");
                                method = interpretCF(encp, crypt_params.getKey("/Name"));
                                method_source = "stream's Crypt decode parameters (array)";
                            }
                        }
                    }
                }
            }
        }

        if (method == e_unknown) {
            if ((!encp->encrypt_metadata) && is_root_metadata) {
                QTC::TC("qpdf", "QPDF_encryption cleartext metadata");
                method = e_none;
            } else {
                method = encp->cf_stream;
            }
        }
        use_aes = false;
        switch (method) {
        case e_none:
            return;
            break;

        case e_aes:
            use_aes = true;
            break;

        case e_aesv3:
            use_aes = true;
            break;

        case e_rc4:
            break;

        default:
            // filter local to this stream.
            qpdf_for_warning.warn(QPDFExc(
                qpdf_e_damaged_pdf,
                file->getName(),
                "",
                file->getLastOffset(),
                "unknown encryption filter for streams (check " + method_source +
                    "); streams may be decrypted improperly"));
            // To avoid repeated warnings, reset cf_stream.  Assume we'd want to use AES if V == 4.
            encp->cf_stream = e_aes;
            use_aes = true;
            break;
        }
    }
    std::string key = getKeyForObject(encp, og, use_aes);
    if (use_aes) {
        QTC::TC("qpdf", "QPDF_encryption aes decode stream");
        decrypt_pipeline = std::make_unique<Pl_AES_PDF>(
            "AES stream decryption",
            pipeline,
            false,
            QUtil::unsigned_char_pointer(key),
            key.length());
    } else {
        QTC::TC("qpdf", "QPDF_encryption rc4 decode stream");
        decrypt_pipeline = std::make_unique<Pl_RC4>(
            "RC4 stream decryption",
            pipeline,
            QUtil::unsigned_char_pointer(key),
            toI(key.length()));
    }
    pipeline = decrypt_pipeline.get();
}